

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O0

bool __thiscall GraphViewer::resetVertexIcon(GraphViewer *this)

{
  Connection *this_00;
  bool bVar1;
  string local_130 [55];
  allocator local_f9;
  string local_f8 [8];
  string str;
  char local_d8 [8];
  char buff [200];
  GraphViewer *this_local;
  
  buff._192_8_ = this;
  sprintf(local_d8,"resetVertexIcon\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,local_d8,&local_f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  this_00 = this->con;
  std::__cxx11::string::string(local_130,local_f8);
  bVar1 = Connection::sendMsg(this_00,(string *)local_130);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_f8);
  return bVar1;
}

Assistant:

bool GraphViewer::resetVertexIcon() {
	char buff[200];
	sprintf(buff, "resetVertexIcon\n");
	string str(buff);
	return con->sendMsg(str);
}